

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

void mi_os_prim_free(void *addr,size_t size,size_t commit_size)

{
  uint uVar1;
  
  if (size == 0 || addr == (void *)0x0) {
    return;
  }
  uVar1 = _mi_prim_free(addr,size);
  if (uVar1 != 0) {
    _mi_warning_message("unable to free OS memory (error: %d (0x%x), size: 0x%zx bytes, address: %p)\n"
                        ,(ulong)uVar1,(ulong)uVar1,size,addr);
  }
  if (commit_size != 0) {
    _mi_stat_decrease(&_mi_stats_main.committed,commit_size);
  }
  _mi_stat_decrease(&_mi_stats_main.reserved,size);
  return;
}

Assistant:

static void mi_os_prim_free(void* addr, size_t size, size_t commit_size) {
  mi_assert_internal((size % _mi_os_page_size()) == 0);
  if (addr == NULL || size == 0) return; // || _mi_os_is_huge_reserved(addr)
  int err = _mi_prim_free(addr, size);
  if (err != 0) {
    _mi_warning_message("unable to free OS memory (error: %d (0x%x), size: 0x%zx bytes, address: %p)\n", err, err, size, addr);
  }
  if (commit_size > 0) {
    mi_os_stat_decrease(committed, commit_size);
  }
  mi_os_stat_decrease(reserved, size);
}